

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ins_ekf_utilities.cpp
# Opt level: O1

Vector3d * ins_ekf::QuatToRPY(Vector3d *__return_storage_ptr__,Vector4d *quat)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar5 = (quat->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
          array[0];
  dVar4 = (quat->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
          array[1];
  dVar2 = (quat->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
          array[3] * dVar5 +
          (quat->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
          array[2] * dVar4;
  dVar5 = dVar5 * dVar5 + dVar4 * dVar4;
  dVar5 = atan2(dVar2 + dVar2,1.0 - (dVar5 + dVar5));
  dVar4 = (quat->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
          array[3] *
          (quat->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
          array[1] -
          (quat->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
          array[0] *
          (quat->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
          array[2];
  dVar4 = dVar4 + dVar4;
  if (ABS(dVar4) <= 0.98) {
    dVar4 = asin(dVar4);
  }
  else {
    dVar4 = *(double *)(&DAT_00114280 + (ulong)(0.0 < dVar4) * 8);
  }
  dVar2 = (quat->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
          array[1];
  dVar1 = (quat->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
          array[2];
  dVar3 = (quat->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
          array[3] * dVar1 +
          (quat->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
          array[0] * dVar2;
  dVar2 = dVar2 * dVar2 + dVar1 * dVar1;
  dVar2 = atan2(dVar3 + dVar3,1.0 - (dVar2 + dVar2));
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[0] = dVar5;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[1] = dVar4;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[2] = dVar2;
  return __return_storage_ptr__;
}

Assistant:

Eigen::Vector3d QuatToRPY(const Eigen::Vector4d& quat){

        // roll (body x axis)
        double sr_cp = 2.0 * (quat[3] * quat[0] + quat[1] * quat[2]);
        double cr_cp = 1.0 - 2.0 * (quat[0] * quat[0] + quat[1] * quat[1]);
        double roll = atan2(sr_cp, cr_cp);

        // pitch (y axis of pre-roll frame)
        double sp = 2.0 * (quat[3] * quat[1] - quat[2] * quat[0]);
        double pitch = 0.0;
        if (std::fabs(sp) > 0.98) // unlikely to be vertical pitch
            pitch = sp > 0 ? M_PI_2 : -M_PI_2;
        else
            pitch = asin(sp);

        // yaw (inertial frame z axis)
        double sy_cp = 2.0 * (quat[3] * quat[2] + quat[0] * quat[1]);
        double cy_cp = 1.0 - 2.0 * (quat[1] * quat[1] + quat[2] * quat[2]);
        double yaw = atan2(sy_cp, cy_cp);

        Eigen::Vector3d rpy {roll, pitch, yaw};

        return rpy;
    }